

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_decoder_config * ma_decoder_config_init_copy(ma_decoder_config *pConfig)

{
  void *in_RSI;
  ma_decoder_config *in_RDI;
  
  if (in_RSI == (void *)0x0) {
    if (in_RDI != (ma_decoder_config *)0x0) {
      memset(in_RDI,0,0x90);
    }
  }
  else {
    memcpy(in_RDI,in_RSI,0x90);
  }
  return in_RDI;
}

Assistant:

MA_API ma_decoder_config ma_decoder_config_init_copy(const ma_decoder_config* pConfig)
{
    ma_decoder_config config;
    if (pConfig != NULL) {
        config = *pConfig;
    } else {
        MA_ZERO_OBJECT(&config);
    }

    return config;
}